

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  long lVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  ulong uVar57;
  long lVar58;
  Scene *pSVar59;
  ulong uVar60;
  ulong *puVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  float fVar89;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  float fVar106;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [64];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar116 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar136 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_18a8;
  undefined1 local_1850 [16];
  undefined1 (*local_1838) [16];
  long local_1830;
  ulong local_1828;
  undefined1 local_1820 [32];
  RTCFilterFunctionNArguments local_17f0;
  Scene *local_17c0;
  undefined1 auStack_17b8 [24];
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  long local_1640;
  undefined1 auStack_1638 [24];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined4 local_15d0;
  undefined4 uStack_15cc;
  undefined4 uStack_15c8;
  undefined4 uStack_15c4;
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [16];
  undefined4 local_15a0;
  undefined4 uStack_159c;
  undefined4 uStack_1598;
  undefined4 uStack_1594;
  undefined1 local_1590 [16];
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined1 local_1570 [16];
  uint local_1560;
  uint uStack_155c;
  uint uStack_1558;
  uint uStack_1554;
  uint uStack_1550;
  uint uStack_154c;
  uint uStack_1548;
  uint uStack_1544;
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  undefined4 uStack_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_16a0._4_4_ = uVar1;
  local_16a0._0_4_ = uVar1;
  local_16a0._8_4_ = uVar1;
  local_16a0._12_4_ = uVar1;
  local_16a0._16_4_ = uVar1;
  local_16a0._20_4_ = uVar1;
  local_16a0._24_4_ = uVar1;
  local_16a0._28_4_ = uVar1;
  auVar102 = ZEXT3264(local_16a0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_16c0._4_4_ = uVar1;
  local_16c0._0_4_ = uVar1;
  local_16c0._8_4_ = uVar1;
  local_16c0._12_4_ = uVar1;
  local_16c0._16_4_ = uVar1;
  local_16c0._20_4_ = uVar1;
  local_16c0._24_4_ = uVar1;
  local_16c0._28_4_ = uVar1;
  auVar105 = ZEXT3264(local_16c0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_16e0._4_4_ = uVar1;
  local_16e0._0_4_ = uVar1;
  local_16e0._8_4_ = uVar1;
  local_16e0._12_4_ = uVar1;
  local_16e0._16_4_ = uVar1;
  local_16e0._20_4_ = uVar1;
  local_16e0._24_4_ = uVar1;
  local_16e0._28_4_ = uVar1;
  auVar109 = ZEXT3264(local_16e0);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar110 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar111 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar112 = fVar106 * 0.99999964;
  fVar113 = fVar110 * 0.99999964;
  fVar114 = fVar111 * 0.99999964;
  fVar106 = fVar106 * 1.0000004;
  fVar110 = fVar110 * 1.0000004;
  fVar111 = fVar111 * 1.0000004;
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1828 = uVar62 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_1660._4_4_ = iVar2;
  local_1660._0_4_ = iVar2;
  local_1660._8_4_ = iVar2;
  local_1660._12_4_ = iVar2;
  local_1660._16_4_ = iVar2;
  local_1660._20_4_ = iVar2;
  local_1660._24_4_ = iVar2;
  local_1660._28_4_ = iVar2;
  auVar83 = ZEXT3264(local_1660);
  iVar2 = (tray->tfar).field_0.i[k];
  local_1680._4_4_ = iVar2;
  local_1680._0_4_ = iVar2;
  local_1680._8_4_ = iVar2;
  local_1680._12_4_ = iVar2;
  local_1680._16_4_ = iVar2;
  local_1680._20_4_ = iVar2;
  local_1680._24_4_ = iVar2;
  local_1680._28_4_ = iVar2;
  auVar88 = ZEXT3264(local_1680);
  local_1520._16_16_ = mm_lookupmask_ps._240_16_;
  local_1520._0_16_ = mm_lookupmask_ps._0_16_;
  local_1838 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = 0x3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar73._16_4_ = 0x3f800000;
  auVar73._20_4_ = 0x3f800000;
  auVar73._24_4_ = 0x3f800000;
  auVar73._28_4_ = 0x3f800000;
  auVar66._8_4_ = 0xbf800000;
  auVar66._0_8_ = 0xbf800000bf800000;
  auVar66._12_4_ = 0xbf800000;
  auVar66._16_4_ = 0xbf800000;
  auVar66._20_4_ = 0xbf800000;
  auVar66._24_4_ = 0xbf800000;
  auVar66._28_4_ = 0xbf800000;
  _local_1540 = vblendvps_avx(auVar73,auVar66,local_1520);
  local_18a8 = local_11f8;
  fVar115 = fVar112;
  fVar117 = fVar112;
  fVar118 = fVar112;
  fVar119 = fVar112;
  fVar120 = fVar112;
  fVar121 = fVar112;
  fVar124 = fVar113;
  fVar125 = fVar113;
  fVar126 = fVar113;
  fVar127 = fVar113;
  fVar128 = fVar113;
  fVar129 = fVar113;
  fVar130 = fVar114;
  fVar131 = fVar114;
  fVar132 = fVar114;
  fVar133 = fVar114;
  fVar134 = fVar114;
  fVar135 = fVar114;
  fVar137 = fVar106;
  fVar138 = fVar106;
  fVar139 = fVar106;
  fVar140 = fVar106;
  fVar141 = fVar106;
  fVar142 = fVar106;
  fVar144 = fVar110;
  fVar145 = fVar110;
  fVar146 = fVar110;
  fVar147 = fVar110;
  fVar148 = fVar110;
  fVar149 = fVar110;
  fVar151 = fVar111;
  fVar152 = fVar111;
  fVar153 = fVar111;
  fVar154 = fVar111;
  fVar155 = fVar111;
  fVar156 = fVar111;
  local_17a0 = fVar111;
  fStack_179c = fVar111;
  fStack_1798 = fVar111;
  fStack_1794 = fVar111;
  fStack_1790 = fVar111;
  fStack_178c = fVar111;
  fStack_1788 = fVar111;
  fStack_1784 = fVar111;
  local_1780 = fVar110;
  fStack_177c = fVar110;
  fStack_1778 = fVar110;
  fStack_1774 = fVar110;
  fStack_1770 = fVar110;
  fStack_176c = fVar110;
  fStack_1768 = fVar110;
  fStack_1764 = fVar110;
  local_1760 = fVar106;
  fStack_175c = fVar106;
  fStack_1758 = fVar106;
  fStack_1754 = fVar106;
  fStack_1750 = fVar106;
  fStack_174c = fVar106;
  fStack_1748 = fVar106;
  fStack_1744 = fVar106;
  local_1740 = fVar114;
  fStack_173c = fVar114;
  fStack_1738 = fVar114;
  fStack_1734 = fVar114;
  fStack_1730 = fVar114;
  fStack_172c = fVar114;
  fStack_1728 = fVar114;
  fStack_1724 = fVar114;
  local_1720 = fVar113;
  fStack_171c = fVar113;
  fStack_1718 = fVar113;
  fStack_1714 = fVar113;
  fStack_1710 = fVar113;
  fStack_170c = fVar113;
  fStack_1708 = fVar113;
  fStack_1704 = fVar113;
  local_1700 = fVar112;
  fStack_16fc = fVar112;
  fStack_16f8 = fVar112;
  fStack_16f4 = fVar112;
  fStack_16f0 = fVar112;
  fStack_16ec = fVar112;
  fStack_16e8 = fVar112;
  fStack_16e4 = fVar112;
LAB_016792ba:
  do {
    puVar61 = local_18a8;
    if (puVar61 == &local_1200) {
LAB_01679dd2:
      return puVar61 != &local_1200;
    }
    local_18a8 = puVar61 + -1;
    uVar65 = puVar61[-1];
    while ((uVar65 & 8) == 0) {
      auVar66 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar62),auVar102._0_32_);
      auVar78._4_4_ = fVar115 * auVar66._4_4_;
      auVar78._0_4_ = fVar112 * auVar66._0_4_;
      auVar78._8_4_ = fVar117 * auVar66._8_4_;
      auVar78._12_4_ = fVar118 * auVar66._12_4_;
      auVar78._16_4_ = fVar119 * auVar66._16_4_;
      auVar78._20_4_ = fVar120 * auVar66._20_4_;
      auVar78._24_4_ = fVar121 * auVar66._24_4_;
      auVar78._28_4_ = auVar66._28_4_;
      auVar66 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar64),auVar105._0_32_);
      auVar28._4_4_ = fVar124 * auVar66._4_4_;
      auVar28._0_4_ = fVar113 * auVar66._0_4_;
      auVar28._8_4_ = fVar125 * auVar66._8_4_;
      auVar28._12_4_ = fVar126 * auVar66._12_4_;
      auVar28._16_4_ = fVar127 * auVar66._16_4_;
      auVar28._20_4_ = fVar128 * auVar66._20_4_;
      auVar28._24_4_ = fVar129 * auVar66._24_4_;
      auVar28._28_4_ = auVar66._28_4_;
      auVar66 = vmaxps_avx(auVar78,auVar28);
      auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar63),auVar109._0_32_);
      auVar29._4_4_ = fVar130 * auVar73._4_4_;
      auVar29._0_4_ = fVar114 * auVar73._0_4_;
      auVar29._8_4_ = fVar131 * auVar73._8_4_;
      auVar29._12_4_ = fVar132 * auVar73._12_4_;
      auVar29._16_4_ = fVar133 * auVar73._16_4_;
      auVar29._20_4_ = fVar134 * auVar73._20_4_;
      auVar29._24_4_ = fVar135 * auVar73._24_4_;
      auVar29._28_4_ = auVar73._28_4_;
      auVar73 = vmaxps_avx(auVar29,auVar83._0_32_);
      auVar66 = vmaxps_avx(auVar66,auVar73);
      auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + local_1828),auVar102._0_32_);
      auVar30._4_4_ = fVar137 * auVar73._4_4_;
      auVar30._0_4_ = fVar106 * auVar73._0_4_;
      auVar30._8_4_ = fVar138 * auVar73._8_4_;
      auVar30._12_4_ = fVar139 * auVar73._12_4_;
      auVar30._16_4_ = fVar140 * auVar73._16_4_;
      auVar30._20_4_ = fVar141 * auVar73._20_4_;
      auVar30._24_4_ = fVar142 * auVar73._24_4_;
      auVar30._28_4_ = auVar73._28_4_;
      auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + (uVar64 ^ 0x20)),auVar105._0_32_);
      auVar31._4_4_ = fVar144 * auVar73._4_4_;
      auVar31._0_4_ = fVar110 * auVar73._0_4_;
      auVar31._8_4_ = fVar145 * auVar73._8_4_;
      auVar31._12_4_ = fVar146 * auVar73._12_4_;
      auVar31._16_4_ = fVar147 * auVar73._16_4_;
      auVar31._20_4_ = fVar148 * auVar73._20_4_;
      auVar31._24_4_ = fVar149 * auVar73._24_4_;
      auVar31._28_4_ = auVar73._28_4_;
      auVar73 = vminps_avx(auVar30,auVar31);
      auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + (uVar63 ^ 0x20)),auVar109._0_32_);
      auVar32._4_4_ = fVar151 * auVar78._4_4_;
      auVar32._0_4_ = fVar111 * auVar78._0_4_;
      auVar32._8_4_ = fVar152 * auVar78._8_4_;
      auVar32._12_4_ = fVar153 * auVar78._12_4_;
      auVar32._16_4_ = fVar154 * auVar78._16_4_;
      auVar32._20_4_ = fVar155 * auVar78._20_4_;
      auVar32._24_4_ = fVar156 * auVar78._24_4_;
      auVar32._28_4_ = auVar78._28_4_;
      auVar78 = vminps_avx(auVar32,auVar88._0_32_);
      auVar73 = vminps_avx(auVar73,auVar78);
      auVar66 = vcmpps_avx(auVar66,auVar73,2);
      uVar56 = vmovmskps_avx(auVar66);
      if (uVar56 == 0) goto LAB_016792ba;
      uVar56 = uVar56 & 0xff;
      uVar57 = uVar65 & 0xfffffffffffffff0;
      lVar34 = 0;
      for (uVar65 = (ulong)uVar56; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      uVar65 = *(ulong *)(uVar57 + lVar34 * 8);
      uVar56 = uVar56 - 1 & uVar56;
      uVar60 = (ulong)uVar56;
      if (uVar56 != 0) {
        do {
          *local_18a8 = uVar65;
          local_18a8 = local_18a8 + 1;
          lVar34 = 0;
          for (uVar65 = uVar60; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar60 = uVar60 - 1 & uVar60;
          uVar65 = *(ulong *)(uVar57 + lVar34 * 8);
        } while (uVar60 != 0);
      }
    }
    local_1830 = (ulong)((uint)uVar65 & 0xf) - 8;
    uVar65 = uVar65 & 0xfffffffffffffff0;
    for (local_1640 = 0; local_1640 != local_1830; local_1640 = local_1640 + 1) {
      lVar58 = local_1640 * 0xe0;
      lVar34 = uVar65 + 0xd0 + lVar58;
      local_1400 = *(undefined8 *)(lVar34 + 0x10);
      uStack_13f8 = *(undefined8 *)(lVar34 + 0x18);
      lVar34 = uVar65 + 0xc0 + lVar58;
      local_13e0 = *(undefined8 *)(lVar34 + 0x10);
      uStack_13d8 = *(undefined8 *)(lVar34 + 0x18);
      uStack_13d0 = local_13e0;
      uStack_13c8 = uStack_13d8;
      uStack_13f0 = local_1400;
      uStack_13e8 = uStack_13f8;
      auVar79._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x60 + lVar58);
      auVar79._0_16_ = *(undefined1 (*) [16])(uVar65 + lVar58);
      auVar70._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x70 + lVar58);
      auVar70._0_16_ = *(undefined1 (*) [16])(uVar65 + 0x10 + lVar58);
      auVar98._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x80 + lVar58);
      auVar98._0_16_ = *(undefined1 (*) [16])(uVar65 + 0x20 + lVar58);
      auVar4 = *(undefined1 (*) [16])(uVar65 + 0x30 + lVar58);
      auVar103._16_16_ = auVar4;
      auVar103._0_16_ = auVar4;
      auVar4 = *(undefined1 (*) [16])(uVar65 + 0x40 + lVar58);
      auVar84._16_16_ = auVar4;
      auVar84._0_16_ = auVar4;
      auVar4 = *(undefined1 (*) [16])(uVar65 + 0x50 + lVar58);
      auVar90._16_16_ = auVar4;
      auVar90._0_16_ = auVar4;
      auVar4 = *(undefined1 (*) [16])(uVar65 + 0x90 + lVar58);
      auVar99._16_16_ = auVar4;
      auVar99._0_16_ = auVar4;
      auVar4 = *(undefined1 (*) [16])(uVar65 + 0xa0 + lVar58);
      auVar150._16_16_ = auVar4;
      auVar150._0_16_ = auVar4;
      auVar4 = *(undefined1 (*) [16])(uVar65 + 0xb0 + lVar58);
      auVar67._16_16_ = auVar4;
      auVar67._0_16_ = auVar4;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar122._4_4_ = uVar1;
      auVar122._0_4_ = uVar1;
      auVar122._8_4_ = uVar1;
      auVar122._12_4_ = uVar1;
      auVar122._16_4_ = uVar1;
      auVar122._20_4_ = uVar1;
      auVar122._24_4_ = uVar1;
      auVar122._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar136._4_4_ = uVar1;
      auVar136._0_4_ = uVar1;
      auVar136._8_4_ = uVar1;
      auVar136._12_4_ = uVar1;
      auVar136._16_4_ = uVar1;
      auVar136._20_4_ = uVar1;
      auVar136._24_4_ = uVar1;
      auVar136._28_4_ = uVar1;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar143._4_4_ = uVar3;
      auVar143._0_4_ = uVar3;
      auVar143._8_4_ = uVar3;
      auVar143._12_4_ = uVar3;
      auVar143._16_4_ = uVar3;
      auVar143._20_4_ = uVar3;
      auVar143._24_4_ = uVar3;
      auVar143._28_4_ = uVar3;
      auVar28 = vsubps_avx(auVar79,auVar122);
      local_1820 = vsubps_avx(auVar70,auVar136);
      local_1600 = vsubps_avx(auVar98,auVar143);
      auVar66 = vsubps_avx(auVar103,auVar122);
      auVar73 = vsubps_avx(auVar84,auVar136);
      auVar78 = vsubps_avx(auVar90,auVar143);
      auVar29 = vsubps_avx(auVar99,auVar122);
      auVar30 = vsubps_avx(auVar150,auVar136);
      auVar31 = vsubps_avx(auVar67,auVar143);
      auVar32 = vsubps_avx(auVar29,auVar28);
      local_1420 = vsubps_avx(auVar30,local_1820);
      auVar67 = vsubps_avx(auVar31,local_1600);
      auVar68._0_4_ = auVar28._0_4_ + auVar29._0_4_;
      auVar68._4_4_ = auVar28._4_4_ + auVar29._4_4_;
      auVar68._8_4_ = auVar28._8_4_ + auVar29._8_4_;
      auVar68._12_4_ = auVar28._12_4_ + auVar29._12_4_;
      auVar68._16_4_ = auVar28._16_4_ + auVar29._16_4_;
      auVar68._20_4_ = auVar28._20_4_ + auVar29._20_4_;
      auVar68._24_4_ = auVar28._24_4_ + auVar29._24_4_;
      auVar68._28_4_ = auVar28._28_4_ + auVar29._28_4_;
      auVar100._0_4_ = auVar30._0_4_ + local_1820._0_4_;
      auVar100._4_4_ = auVar30._4_4_ + local_1820._4_4_;
      auVar100._8_4_ = auVar30._8_4_ + local_1820._8_4_;
      auVar100._12_4_ = auVar30._12_4_ + local_1820._12_4_;
      auVar100._16_4_ = auVar30._16_4_ + local_1820._16_4_;
      auVar100._20_4_ = auVar30._20_4_ + local_1820._20_4_;
      auVar100._24_4_ = auVar30._24_4_ + local_1820._24_4_;
      auVar100._28_4_ = auVar30._28_4_ + local_1820._28_4_;
      fVar7 = local_1600._0_4_;
      auVar85._0_4_ = auVar31._0_4_ + fVar7;
      fVar8 = local_1600._4_4_;
      auVar85._4_4_ = auVar31._4_4_ + fVar8;
      fVar9 = local_1600._8_4_;
      auVar85._8_4_ = auVar31._8_4_ + fVar9;
      fVar10 = local_1600._12_4_;
      auVar85._12_4_ = auVar31._12_4_ + fVar10;
      fVar11 = local_1600._16_4_;
      auVar85._16_4_ = auVar31._16_4_ + fVar11;
      fVar12 = local_1600._20_4_;
      auVar85._20_4_ = auVar31._20_4_ + fVar12;
      fVar13 = local_1600._24_4_;
      auVar85._24_4_ = auVar31._24_4_ + fVar13;
      fVar110 = auVar31._28_4_;
      auVar85._28_4_ = fVar110 + local_1600._28_4_;
      auVar33._4_4_ = auVar67._4_4_ * auVar100._4_4_;
      auVar33._0_4_ = auVar67._0_4_ * auVar100._0_4_;
      auVar33._8_4_ = auVar67._8_4_ * auVar100._8_4_;
      auVar33._12_4_ = auVar67._12_4_ * auVar100._12_4_;
      auVar33._16_4_ = auVar67._16_4_ * auVar100._16_4_;
      auVar33._20_4_ = auVar67._20_4_ * auVar100._20_4_;
      auVar33._24_4_ = auVar67._24_4_ * auVar100._24_4_;
      auVar33._28_4_ = uVar1;
      auVar69 = vfmsub231ps_fma(auVar33,local_1420,auVar85);
      auVar38._4_4_ = auVar32._4_4_ * auVar85._4_4_;
      auVar38._0_4_ = auVar32._0_4_ * auVar85._0_4_;
      auVar38._8_4_ = auVar32._8_4_ * auVar85._8_4_;
      auVar38._12_4_ = auVar32._12_4_ * auVar85._12_4_;
      auVar38._16_4_ = auVar32._16_4_ * auVar85._16_4_;
      auVar38._20_4_ = auVar32._20_4_ * auVar85._20_4_;
      auVar38._24_4_ = auVar32._24_4_ * auVar85._24_4_;
      auVar38._28_4_ = auVar85._28_4_;
      auVar4 = vfmsub231ps_fma(auVar38,auVar67,auVar68);
      auVar39._4_4_ = local_1420._4_4_ * auVar68._4_4_;
      auVar39._0_4_ = local_1420._0_4_ * auVar68._0_4_;
      auVar39._8_4_ = local_1420._8_4_ * auVar68._8_4_;
      auVar39._12_4_ = local_1420._12_4_ * auVar68._12_4_;
      auVar39._16_4_ = local_1420._16_4_ * auVar68._16_4_;
      auVar39._20_4_ = local_1420._20_4_ * auVar68._20_4_;
      auVar39._24_4_ = local_1420._24_4_ * auVar68._24_4_;
      auVar39._28_4_ = auVar68._28_4_;
      auVar72 = vfmsub231ps_fma(auVar39,auVar32,auVar100);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar123._4_4_ = uVar1;
      auVar123._0_4_ = uVar1;
      auVar123._8_4_ = uVar1;
      auVar123._12_4_ = uVar1;
      auVar123._16_4_ = uVar1;
      auVar123._20_4_ = uVar1;
      auVar123._24_4_ = uVar1;
      auVar123._28_4_ = uVar1;
      local_1460 = *(float *)(ray + k * 4 + 0x60);
      auVar40._4_4_ = local_1460 * auVar72._4_4_;
      auVar40._0_4_ = local_1460 * auVar72._0_4_;
      auVar40._8_4_ = local_1460 * auVar72._8_4_;
      auVar40._12_4_ = local_1460 * auVar72._12_4_;
      auVar40._16_4_ = local_1460 * 0.0;
      auVar40._20_4_ = local_1460 * 0.0;
      auVar40._24_4_ = local_1460 * 0.0;
      auVar40._28_4_ = fVar110;
      auVar4 = vfmadd231ps_fma(auVar40,auVar123,ZEXT1632(auVar4));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_1440._4_4_ = uVar1;
      local_1440._0_4_ = uVar1;
      local_1440._8_4_ = uVar1;
      local_1440._12_4_ = uVar1;
      local_1440._16_4_ = uVar1;
      local_1440._20_4_ = uVar1;
      local_1440._24_4_ = uVar1;
      local_1440._28_4_ = uVar1;
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),local_1440,ZEXT1632(auVar69));
      local_1480 = vsubps_avx(local_1820,auVar73);
      local_14a0 = vsubps_avx(local_1600,auVar78);
      auVar74._0_4_ = auVar73._0_4_ + local_1820._0_4_;
      auVar74._4_4_ = auVar73._4_4_ + local_1820._4_4_;
      auVar74._8_4_ = auVar73._8_4_ + local_1820._8_4_;
      auVar74._12_4_ = auVar73._12_4_ + local_1820._12_4_;
      auVar74._16_4_ = auVar73._16_4_ + local_1820._16_4_;
      auVar74._20_4_ = auVar73._20_4_ + local_1820._20_4_;
      auVar74._24_4_ = auVar73._24_4_ + local_1820._24_4_;
      auVar74._28_4_ = auVar73._28_4_ + local_1820._28_4_;
      auVar86._0_4_ = fVar7 + auVar78._0_4_;
      auVar86._4_4_ = fVar8 + auVar78._4_4_;
      auVar86._8_4_ = fVar9 + auVar78._8_4_;
      auVar86._12_4_ = fVar10 + auVar78._12_4_;
      auVar86._16_4_ = fVar11 + auVar78._16_4_;
      auVar86._20_4_ = fVar12 + auVar78._20_4_;
      auVar86._24_4_ = fVar13 + auVar78._24_4_;
      fVar106 = auVar78._28_4_;
      auVar86._28_4_ = local_1600._28_4_ + fVar106;
      fVar89 = local_14a0._0_4_;
      fVar94 = local_14a0._4_4_;
      auVar41._4_4_ = auVar74._4_4_ * fVar94;
      auVar41._0_4_ = auVar74._0_4_ * fVar89;
      fVar97 = local_14a0._8_4_;
      auVar41._8_4_ = auVar74._8_4_ * fVar97;
      fVar16 = local_14a0._12_4_;
      auVar41._12_4_ = auVar74._12_4_ * fVar16;
      fVar19 = local_14a0._16_4_;
      auVar41._16_4_ = auVar74._16_4_ * fVar19;
      fVar22 = local_14a0._20_4_;
      auVar41._20_4_ = auVar74._20_4_ * fVar22;
      fVar25 = local_14a0._24_4_;
      auVar41._24_4_ = auVar74._24_4_ * fVar25;
      auVar41._28_4_ = auVar100._28_4_;
      auVar72 = vfmsub231ps_fma(auVar41,local_1480,auVar86);
      local_14c0 = vsubps_avx(auVar28,auVar66);
      fVar92 = local_14c0._0_4_;
      fVar95 = local_14c0._4_4_;
      auVar42._4_4_ = auVar86._4_4_ * fVar95;
      auVar42._0_4_ = auVar86._0_4_ * fVar92;
      fVar14 = local_14c0._8_4_;
      auVar42._8_4_ = auVar86._8_4_ * fVar14;
      fVar17 = local_14c0._12_4_;
      auVar42._12_4_ = auVar86._12_4_ * fVar17;
      fVar20 = local_14c0._16_4_;
      auVar42._16_4_ = auVar86._16_4_ * fVar20;
      fVar23 = local_14c0._20_4_;
      auVar42._20_4_ = auVar86._20_4_ * fVar23;
      fVar26 = local_14c0._24_4_;
      auVar42._24_4_ = auVar86._24_4_ * fVar26;
      auVar42._28_4_ = auVar86._28_4_;
      auVar107._0_4_ = auVar28._0_4_ + auVar66._0_4_;
      auVar107._4_4_ = auVar28._4_4_ + auVar66._4_4_;
      auVar107._8_4_ = auVar28._8_4_ + auVar66._8_4_;
      auVar107._12_4_ = auVar28._12_4_ + auVar66._12_4_;
      auVar107._16_4_ = auVar28._16_4_ + auVar66._16_4_;
      auVar107._20_4_ = auVar28._20_4_ + auVar66._20_4_;
      auVar107._24_4_ = auVar28._24_4_ + auVar66._24_4_;
      auVar107._28_4_ = auVar28._28_4_ + auVar66._28_4_;
      auVar69 = vfmsub231ps_fma(auVar42,local_14a0,auVar107);
      fVar93 = local_1480._0_4_;
      fVar96 = local_1480._4_4_;
      auVar43._4_4_ = auVar107._4_4_ * fVar96;
      auVar43._0_4_ = auVar107._0_4_ * fVar93;
      fVar15 = local_1480._8_4_;
      auVar43._8_4_ = auVar107._8_4_ * fVar15;
      fVar18 = local_1480._12_4_;
      auVar43._12_4_ = auVar107._12_4_ * fVar18;
      fVar21 = local_1480._16_4_;
      auVar43._16_4_ = auVar107._16_4_ * fVar21;
      fVar24 = local_1480._20_4_;
      auVar43._20_4_ = auVar107._20_4_ * fVar24;
      fVar27 = local_1480._24_4_;
      auVar43._24_4_ = auVar107._24_4_ * fVar27;
      auVar43._28_4_ = auVar107._28_4_;
      auVar36 = vfmsub231ps_fma(auVar43,local_14c0,auVar74);
      auVar108._0_4_ = auVar36._0_4_ * local_1460;
      auVar108._4_4_ = auVar36._4_4_ * local_1460;
      auVar108._8_4_ = auVar36._8_4_ * local_1460;
      auVar108._12_4_ = auVar36._12_4_ * local_1460;
      auVar108._16_4_ = local_1460 * 0.0;
      auVar108._20_4_ = local_1460 * 0.0;
      auVar108._24_4_ = local_1460 * 0.0;
      auVar108._28_4_ = 0;
      auVar69 = vfmadd231ps_fma(auVar108,auVar123,ZEXT1632(auVar69));
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_1440,ZEXT1632(auVar72));
      auVar33 = vsubps_avx(auVar66,auVar29);
      auVar80._0_4_ = auVar66._0_4_ + auVar29._0_4_;
      auVar80._4_4_ = auVar66._4_4_ + auVar29._4_4_;
      auVar80._8_4_ = auVar66._8_4_ + auVar29._8_4_;
      auVar80._12_4_ = auVar66._12_4_ + auVar29._12_4_;
      auVar80._16_4_ = auVar66._16_4_ + auVar29._16_4_;
      auVar80._20_4_ = auVar66._20_4_ + auVar29._20_4_;
      auVar80._24_4_ = auVar66._24_4_ + auVar29._24_4_;
      auVar80._28_4_ = auVar66._28_4_ + auVar29._28_4_;
      auVar29 = vsubps_avx(auVar73,auVar30);
      auVar91._0_4_ = auVar73._0_4_ + auVar30._0_4_;
      auVar91._4_4_ = auVar73._4_4_ + auVar30._4_4_;
      auVar91._8_4_ = auVar73._8_4_ + auVar30._8_4_;
      auVar91._12_4_ = auVar73._12_4_ + auVar30._12_4_;
      auVar91._16_4_ = auVar73._16_4_ + auVar30._16_4_;
      auVar91._20_4_ = auVar73._20_4_ + auVar30._20_4_;
      auVar91._24_4_ = auVar73._24_4_ + auVar30._24_4_;
      auVar91._28_4_ = auVar73._28_4_ + auVar30._28_4_;
      auVar30 = vsubps_avx(auVar78,auVar31);
      auVar75._0_4_ = auVar78._0_4_ + auVar31._0_4_;
      auVar75._4_4_ = auVar78._4_4_ + auVar31._4_4_;
      auVar75._8_4_ = auVar78._8_4_ + auVar31._8_4_;
      auVar75._12_4_ = auVar78._12_4_ + auVar31._12_4_;
      auVar75._16_4_ = auVar78._16_4_ + auVar31._16_4_;
      auVar75._20_4_ = auVar78._20_4_ + auVar31._20_4_;
      auVar75._24_4_ = auVar78._24_4_ + auVar31._24_4_;
      auVar75._28_4_ = fVar106 + fVar110;
      auVar44._4_4_ = auVar30._4_4_ * auVar91._4_4_;
      auVar44._0_4_ = auVar30._0_4_ * auVar91._0_4_;
      auVar44._8_4_ = auVar30._8_4_ * auVar91._8_4_;
      auVar44._12_4_ = auVar30._12_4_ * auVar91._12_4_;
      auVar44._16_4_ = auVar30._16_4_ * auVar91._16_4_;
      auVar44._20_4_ = auVar30._20_4_ * auVar91._20_4_;
      auVar44._24_4_ = auVar30._24_4_ * auVar91._24_4_;
      auVar44._28_4_ = fVar106;
      auVar36 = vfmsub231ps_fma(auVar44,auVar29,auVar75);
      auVar45._4_4_ = auVar75._4_4_ * auVar33._4_4_;
      auVar45._0_4_ = auVar75._0_4_ * auVar33._0_4_;
      auVar45._8_4_ = auVar75._8_4_ * auVar33._8_4_;
      auVar45._12_4_ = auVar75._12_4_ * auVar33._12_4_;
      auVar45._16_4_ = auVar75._16_4_ * auVar33._16_4_;
      auVar45._20_4_ = auVar75._20_4_ * auVar33._20_4_;
      auVar45._24_4_ = auVar75._24_4_ * auVar33._24_4_;
      auVar45._28_4_ = auVar75._28_4_;
      auVar72 = vfmsub231ps_fma(auVar45,auVar30,auVar80);
      auVar46._4_4_ = auVar29._4_4_ * auVar80._4_4_;
      auVar46._0_4_ = auVar29._0_4_ * auVar80._0_4_;
      auVar46._8_4_ = auVar29._8_4_ * auVar80._8_4_;
      auVar46._12_4_ = auVar29._12_4_ * auVar80._12_4_;
      auVar46._16_4_ = auVar29._16_4_ * auVar80._16_4_;
      auVar46._20_4_ = auVar29._20_4_ * auVar80._20_4_;
      auVar46._24_4_ = auVar29._24_4_ * auVar80._24_4_;
      auVar46._28_4_ = auVar80._28_4_;
      auVar37 = vfmsub231ps_fma(auVar46,auVar33,auVar91);
      auVar81._0_4_ = local_1460 * auVar37._0_4_;
      auVar81._4_4_ = local_1460 * auVar37._4_4_;
      auVar81._8_4_ = local_1460 * auVar37._8_4_;
      auVar81._12_4_ = local_1460 * auVar37._12_4_;
      auVar81._16_4_ = local_1460 * 0.0;
      auVar81._20_4_ = local_1460 * 0.0;
      auVar81._24_4_ = local_1460 * 0.0;
      auVar81._28_4_ = 0;
      auVar72 = vfmadd231ps_fma(auVar81,auVar123,ZEXT1632(auVar72));
      auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_1440,ZEXT1632(auVar36));
      local_13a0 = ZEXT1632(auVar69);
      local_13c0 = auVar4._0_4_;
      fStack_13bc = auVar4._4_4_;
      fStack_13b8 = auVar4._8_4_;
      fStack_13b4 = auVar4._12_4_;
      local_1380 = ZEXT1632(CONCAT412(auVar72._12_4_ + auVar69._12_4_ + fStack_13b4,
                                      CONCAT48(auVar72._8_4_ + auVar69._8_4_ + fStack_13b8,
                                               CONCAT44(auVar72._4_4_ + auVar69._4_4_ + fStack_13bc,
                                                        auVar72._0_4_ + auVar69._0_4_ + local_13c0))
                                     ));
      auVar76._8_4_ = 0x7fffffff;
      auVar76._0_8_ = 0x7fffffff7fffffff;
      auVar76._12_4_ = 0x7fffffff;
      auVar76._16_4_ = 0x7fffffff;
      auVar76._20_4_ = 0x7fffffff;
      auVar76._24_4_ = 0x7fffffff;
      auVar76._28_4_ = 0x7fffffff;
      auVar66 = vminps_avx(ZEXT1632(auVar4),local_13a0);
      auVar66 = vminps_avx(auVar66,ZEXT1632(auVar72));
      local_1500 = vandps_avx(local_1380,auVar76);
      fVar106 = local_1500._0_4_ * 1.1920929e-07;
      fVar110 = local_1500._4_4_ * 1.1920929e-07;
      auVar47._4_4_ = fVar110;
      auVar47._0_4_ = fVar106;
      fVar111 = local_1500._8_4_ * 1.1920929e-07;
      auVar47._8_4_ = fVar111;
      fVar112 = local_1500._12_4_ * 1.1920929e-07;
      auVar47._12_4_ = fVar112;
      fVar113 = local_1500._16_4_ * 1.1920929e-07;
      auVar47._16_4_ = fVar113;
      fVar114 = local_1500._20_4_ * 1.1920929e-07;
      auVar47._20_4_ = fVar114;
      fVar115 = local_1500._24_4_ * 1.1920929e-07;
      auVar47._24_4_ = fVar115;
      auVar47._28_4_ = 0x34000000;
      auVar101._0_8_ = CONCAT44(fVar110,fVar106) ^ 0x8000000080000000;
      auVar101._8_4_ = -fVar111;
      auVar101._12_4_ = -fVar112;
      auVar101._16_4_ = -fVar113;
      auVar101._20_4_ = -fVar114;
      auVar101._24_4_ = -fVar115;
      auVar101._28_4_ = 0xb4000000;
      auVar66 = vcmpps_avx(auVar66,auVar101,5);
      local_14e0 = ZEXT1632(auVar4);
      auVar78 = vmaxps_avx(local_14e0,local_13a0);
      auVar73 = vmaxps_avx(auVar78,ZEXT1632(auVar72));
      auVar73 = vcmpps_avx(auVar73,auVar47,2);
      auVar73 = vorps_avx(auVar66,auVar73);
      fVar115 = fStack_16fc;
      fVar117 = fStack_16f8;
      fVar118 = fStack_16f4;
      fVar119 = fStack_16f0;
      fVar120 = fStack_16ec;
      fVar121 = fStack_16e8;
      fVar112 = local_1700;
      fVar124 = fStack_171c;
      fVar125 = fStack_1718;
      fVar126 = fStack_1714;
      fVar127 = fStack_1710;
      fVar128 = fStack_170c;
      fVar129 = fStack_1708;
      fVar113 = local_1720;
      fVar130 = fStack_173c;
      fVar131 = fStack_1738;
      fVar132 = fStack_1734;
      fVar133 = fStack_1730;
      fVar134 = fStack_172c;
      fVar135 = fStack_1728;
      fVar114 = local_1740;
      fVar137 = fStack_175c;
      fVar138 = fStack_1758;
      fVar139 = fStack_1754;
      fVar140 = fStack_1750;
      fVar141 = fStack_174c;
      fVar142 = fStack_1748;
      fVar106 = local_1760;
      fVar144 = fStack_177c;
      fVar145 = fStack_1778;
      fVar146 = fStack_1774;
      fVar147 = fStack_1770;
      fVar148 = fStack_176c;
      fVar149 = fStack_1768;
      fVar110 = local_1780;
      fVar151 = fStack_179c;
      fVar152 = fStack_1798;
      fVar153 = fStack_1794;
      fVar154 = fStack_1790;
      fVar155 = fStack_178c;
      fVar156 = fStack_1788;
      fVar111 = local_17a0;
      if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar73 >> 0x7f,0) == '\0') &&
            (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar73 >> 0xbf,0) == '\0') &&
          (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar73[0x1f])
      {
LAB_01679d37:
        auVar102 = ZEXT3264(local_16a0);
        auVar105 = ZEXT3264(local_16c0);
        auVar109 = ZEXT3264(local_16e0);
        auVar83 = ZEXT3264(local_1660);
        auVar88 = ZEXT3264(local_1680);
      }
      else {
        auVar48._4_4_ = fVar96 * auVar67._4_4_;
        auVar48._0_4_ = fVar93 * auVar67._0_4_;
        auVar48._8_4_ = fVar15 * auVar67._8_4_;
        auVar48._12_4_ = fVar18 * auVar67._12_4_;
        auVar48._16_4_ = fVar21 * auVar67._16_4_;
        auVar48._20_4_ = fVar24 * auVar67._20_4_;
        auVar48._24_4_ = fVar27 * auVar67._24_4_;
        auVar48._28_4_ = auVar66._28_4_;
        auVar49._4_4_ = fVar95 * local_1420._4_4_;
        auVar49._0_4_ = fVar92 * local_1420._0_4_;
        auVar49._8_4_ = fVar14 * local_1420._8_4_;
        auVar49._12_4_ = fVar17 * local_1420._12_4_;
        auVar49._16_4_ = fVar20 * local_1420._16_4_;
        auVar49._20_4_ = fVar23 * local_1420._20_4_;
        auVar49._24_4_ = fVar26 * local_1420._24_4_;
        auVar49._28_4_ = 0x34000000;
        auVar4 = vfmsub213ps_fma(local_1420,local_14a0,auVar48);
        auVar50._4_4_ = auVar29._4_4_ * fVar94;
        auVar50._0_4_ = auVar29._0_4_ * fVar89;
        auVar50._8_4_ = auVar29._8_4_ * fVar97;
        auVar50._12_4_ = auVar29._12_4_ * fVar16;
        auVar50._16_4_ = auVar29._16_4_ * fVar19;
        auVar50._20_4_ = auVar29._20_4_ * fVar22;
        auVar50._24_4_ = auVar29._24_4_ * fVar25;
        auVar50._28_4_ = auVar78._28_4_;
        auVar51._4_4_ = fVar95 * auVar30._4_4_;
        auVar51._0_4_ = fVar92 * auVar30._0_4_;
        auVar51._8_4_ = fVar14 * auVar30._8_4_;
        auVar51._12_4_ = fVar17 * auVar30._12_4_;
        auVar51._16_4_ = fVar20 * auVar30._16_4_;
        auVar51._20_4_ = fVar23 * auVar30._20_4_;
        auVar51._24_4_ = fVar26 * auVar30._24_4_;
        auVar51._28_4_ = local_1500._28_4_;
        auVar72 = vfmsub213ps_fma(auVar30,local_1480,auVar50);
        auVar66 = vandps_avx(auVar48,auVar76);
        auVar78 = vandps_avx(auVar50,auVar76);
        auVar66 = vcmpps_avx(auVar66,auVar78,1);
        local_1360 = vblendvps_avx(ZEXT1632(auVar72),ZEXT1632(auVar4),auVar66);
        auVar52._4_4_ = fVar96 * auVar33._4_4_;
        auVar52._0_4_ = fVar93 * auVar33._0_4_;
        auVar52._8_4_ = fVar15 * auVar33._8_4_;
        auVar52._12_4_ = fVar18 * auVar33._12_4_;
        auVar52._16_4_ = fVar21 * auVar33._16_4_;
        auVar52._20_4_ = fVar24 * auVar33._20_4_;
        auVar52._24_4_ = fVar27 * auVar33._24_4_;
        auVar52._28_4_ = auVar66._28_4_;
        auVar4 = vfmsub213ps_fma(auVar33,local_14a0,auVar51);
        auVar53._4_4_ = auVar32._4_4_ * fVar94;
        auVar53._0_4_ = auVar32._0_4_ * fVar89;
        auVar53._8_4_ = auVar32._8_4_ * fVar97;
        auVar53._12_4_ = auVar32._12_4_ * fVar16;
        auVar53._16_4_ = auVar32._16_4_ * fVar19;
        auVar53._20_4_ = auVar32._20_4_ * fVar22;
        auVar53._24_4_ = auVar32._24_4_ * fVar25;
        auVar53._28_4_ = auVar78._28_4_;
        auVar72 = vfmsub213ps_fma(auVar67,local_14c0,auVar53);
        auVar66 = vandps_avx(auVar53,auVar76);
        auVar78 = vandps_avx(auVar51,auVar76);
        auVar66 = vcmpps_avx(auVar66,auVar78,1);
        local_1340 = vblendvps_avx(ZEXT1632(auVar4),ZEXT1632(auVar72),auVar66);
        auVar4 = vfmsub213ps_fma(auVar32,local_1480,auVar49);
        auVar72 = vfmsub213ps_fma(auVar29,local_14c0,auVar52);
        auVar66 = vandps_avx(auVar49,auVar76);
        auVar78 = vandps_avx(auVar52,auVar76);
        auVar66 = vcmpps_avx(auVar66,auVar78,1);
        local_1320 = vblendvps_avx(ZEXT1632(auVar72),ZEXT1632(auVar4),auVar66);
        auVar4 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
        fVar89 = local_1320._0_4_;
        auVar77._0_4_ = fVar89 * local_1460;
        fVar92 = local_1320._4_4_;
        auVar77._4_4_ = fVar92 * local_1460;
        fVar93 = local_1320._8_4_;
        auVar77._8_4_ = fVar93 * local_1460;
        fVar94 = local_1320._12_4_;
        auVar77._12_4_ = fVar94 * local_1460;
        fVar95 = local_1320._16_4_;
        auVar77._16_4_ = fVar95 * local_1460;
        fVar96 = local_1320._20_4_;
        auVar77._20_4_ = fVar96 * local_1460;
        fVar97 = local_1320._24_4_;
        auVar77._24_4_ = fVar97 * local_1460;
        auVar77._28_4_ = 0;
        auVar72 = vfmadd213ps_fma(auVar123,local_1340,auVar77);
        auVar72 = vfmadd213ps_fma(local_1440,local_1360,ZEXT1632(auVar72));
        auVar78 = ZEXT1632(CONCAT412(auVar72._12_4_ + auVar72._12_4_,
                                     CONCAT48(auVar72._8_4_ + auVar72._8_4_,
                                              CONCAT44(auVar72._4_4_ + auVar72._4_4_,
                                                       auVar72._0_4_ + auVar72._0_4_))));
        auVar54._4_4_ = fVar92 * fVar8;
        auVar54._0_4_ = fVar89 * fVar7;
        auVar54._8_4_ = fVar93 * fVar9;
        auVar54._12_4_ = fVar94 * fVar10;
        auVar54._16_4_ = fVar95 * fVar11;
        auVar54._20_4_ = fVar96 * fVar12;
        auVar54._24_4_ = fVar97 * fVar13;
        auVar54._28_4_ = auVar73._28_4_;
        auVar72 = vfmadd213ps_fma(local_1820,local_1340,auVar54);
        auVar36 = vfmadd213ps_fma(auVar28,local_1360,ZEXT1632(auVar72));
        auVar66 = vrcpps_avx(auVar78);
        auVar116._8_4_ = 0x3f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._12_4_ = 0x3f800000;
        auVar116._16_4_ = 0x3f800000;
        auVar116._20_4_ = 0x3f800000;
        auVar116._24_4_ = 0x3f800000;
        auVar116._28_4_ = 0x3f800000;
        auVar72 = vfnmadd213ps_fma(auVar66,auVar78,auVar116);
        auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar66,auVar66);
        local_12a0 = ZEXT1632(CONCAT412(auVar72._12_4_ * (auVar36._12_4_ + auVar36._12_4_),
                                        CONCAT48(auVar72._8_4_ * (auVar36._8_4_ + auVar36._8_4_),
                                                 CONCAT44(auVar72._4_4_ *
                                                          (auVar36._4_4_ + auVar36._4_4_),
                                                          auVar72._0_4_ *
                                                          (auVar36._0_4_ + auVar36._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar104._4_4_ = uVar1;
        auVar104._0_4_ = uVar1;
        auVar104._8_4_ = uVar1;
        auVar104._12_4_ = uVar1;
        auVar104._16_4_ = uVar1;
        auVar104._20_4_ = uVar1;
        auVar104._24_4_ = uVar1;
        auVar104._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1620._4_4_ = uVar1;
        local_1620._0_4_ = uVar1;
        local_1620._8_4_ = uVar1;
        local_1620._12_4_ = uVar1;
        local_1620._16_4_ = uVar1;
        local_1620._20_4_ = uVar1;
        local_1620._24_4_ = uVar1;
        local_1620._28_4_ = uVar1;
        auVar66 = vcmpps_avx(auVar104,local_12a0,2);
        auVar73 = vcmpps_avx(local_12a0,local_1620,2);
        auVar66 = vandps_avx(auVar66,auVar73);
        auVar72 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
        auVar4 = vpand_avx(auVar72,auVar4);
        auVar66 = vpmovsxwd_avx2(auVar4);
        if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar66 >> 0x7f,0) == '\0') &&
              (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar66 >> 0xbf,0) == '\0') &&
            (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar66[0x1f]) goto LAB_01679d37;
        auVar66 = vcmpps_avx(auVar78,_DAT_01f7b000,4);
        auVar72 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
        auVar4 = vpand_avx(auVar4,auVar72);
        local_1300 = vpmovsxwd_avx2(auVar4);
        if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_1300 >> 0x7f,0) == '\0') &&
              (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_1300 >> 0xbf,0) == '\0') &&
            (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_1300[0x1f]) goto LAB_01679d37;
        auStack_1638 = auVar67._8_24_;
        uStack_13b0 = 0;
        uStack_13ac = 0;
        uStack_13a8 = 0;
        uStack_13a4 = 0;
        local_1220 = local_1520;
        auVar66 = vrcpps_avx(local_1380);
        auVar87._8_4_ = 0x3f800000;
        auVar87._0_8_ = 0x3f8000003f800000;
        auVar87._12_4_ = 0x3f800000;
        auVar87._16_4_ = 0x3f800000;
        auVar87._20_4_ = 0x3f800000;
        auVar87._24_4_ = 0x3f800000;
        auVar87._28_4_ = 0x3f800000;
        auVar72 = vfnmadd213ps_fma(local_1380,auVar66,auVar87);
        auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar66,auVar66);
        auVar82._8_4_ = 0x219392ef;
        auVar82._0_8_ = 0x219392ef219392ef;
        auVar82._12_4_ = 0x219392ef;
        auVar82._16_4_ = 0x219392ef;
        auVar82._20_4_ = 0x219392ef;
        auVar82._24_4_ = 0x219392ef;
        auVar82._28_4_ = 0x219392ef;
        auVar66 = vcmpps_avx(local_1500,auVar82,5);
        auVar66 = vandps_avx(auVar66,ZEXT1632(auVar72));
        auVar55._4_4_ = fStack_13bc * auVar66._4_4_;
        auVar55._0_4_ = local_13c0 * auVar66._0_4_;
        auVar55._8_4_ = fStack_13b8 * auVar66._8_4_;
        auVar55._12_4_ = fStack_13b4 * auVar66._12_4_;
        auVar55._16_4_ = auVar66._16_4_ * 0.0;
        auVar55._20_4_ = auVar66._20_4_ * 0.0;
        auVar55._24_4_ = auVar66._24_4_ * 0.0;
        auVar55._28_4_ = 0;
        auVar73 = vminps_avx(auVar55,auVar87);
        auVar71._0_4_ = auVar69._0_4_ * auVar66._0_4_;
        auVar71._4_4_ = auVar69._4_4_ * auVar66._4_4_;
        auVar71._8_4_ = auVar69._8_4_ * auVar66._8_4_;
        auVar71._12_4_ = auVar69._12_4_ * auVar66._12_4_;
        auVar71._16_4_ = auVar66._16_4_ * 0.0;
        auVar71._20_4_ = auVar66._20_4_ * 0.0;
        auVar71._24_4_ = auVar66._24_4_ * 0.0;
        auVar71._28_4_ = 0;
        auVar66 = vminps_avx(auVar71,auVar87);
        auVar78 = vsubps_avx(auVar87,auVar73);
        auVar29 = vsubps_avx(auVar87,auVar66);
        local_12c0 = vblendvps_avx(auVar66,auVar78,local_1520);
        local_12e0 = vblendvps_avx(auVar73,auVar29,local_1520);
        local_1260._4_4_ = (float)local_1540._4_4_ * local_1340._4_4_;
        local_1260._0_4_ = (float)local_1540._0_4_ * local_1340._0_4_;
        local_1260._8_4_ = fStack_1538 * local_1340._8_4_;
        local_1260._12_4_ = fStack_1534 * local_1340._12_4_;
        local_1260._16_4_ = fStack_1530 * local_1340._16_4_;
        local_1260._20_4_ = fStack_152c * local_1340._20_4_;
        local_1260._24_4_ = fStack_1528 * local_1340._24_4_;
        local_1260._28_4_ = local_12c0._28_4_;
        local_1280[0] = local_1360._0_4_ * (float)local_1540._0_4_;
        local_1280[1] = local_1360._4_4_ * (float)local_1540._4_4_;
        local_1280[2] = local_1360._8_4_ * fStack_1538;
        local_1280[3] = local_1360._12_4_ * fStack_1534;
        fStack_1270 = local_1360._16_4_ * fStack_1530;
        fStack_126c = local_1360._20_4_ * fStack_152c;
        fStack_1268 = local_1360._24_4_ * fStack_1528;
        uStack_1264 = local_12e0._28_4_;
        local_1240[0] = (float)local_1540._0_4_ * fVar89;
        local_1240[1] = (float)local_1540._4_4_ * fVar92;
        local_1240[2] = fStack_1538 * fVar93;
        local_1240[3] = fStack_1534 * fVar94;
        fStack_1230 = fStack_1530 * fVar95;
        fStack_122c = fStack_152c * fVar96;
        fStack_1228 = fStack_1528 * fVar97;
        uStack_1224 = uStack_1524;
        auVar4 = vpacksswb_avx(auVar4,auVar4);
        uVar57 = (ulong)(byte)(SUB161(auVar4 >> 7,0) & 1 | (SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar4 >> 0x37,0) & 1) << 6 | SUB161(auVar4 >> 0x3f,0) << 7);
        auVar102 = ZEXT3264(local_16a0);
        auVar105 = ZEXT3264(local_16c0);
        auVar109 = ZEXT3264(local_16e0);
        auVar83 = ZEXT3264(local_1660);
        auVar88 = ZEXT3264(local_1680);
        auStack_17b8 = auVar28._8_24_;
        local_17c0 = context->scene;
        pSVar59 = context->scene;
        fStack_145c = local_1460;
        fStack_1458 = local_1460;
        fStack_1454 = local_1460;
        fStack_1450 = local_1460;
        fStack_144c = local_1460;
        fStack_1448 = local_1460;
        fStack_1444 = local_1460;
        do {
          uVar60 = 0;
          for (uVar35 = uVar57; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            uVar60 = uVar60 + 1;
          }
          uVar56 = *(uint *)((long)&local_13e0 + uVar60 * 4);
          pGVar5 = (pSVar59->geometries).items[uVar56].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_1820._0_8_ = uVar60;
            local_1600._0_8_ = uVar57;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar57 = (ulong)(uint)((int)uVar60 * 4);
              local_15a0 = *(undefined4 *)(local_12e0 + uVar57);
              uVar1 = *(undefined4 *)(local_12c0 + uVar57);
              local_1590._4_4_ = uVar1;
              local_1590._0_4_ = uVar1;
              local_1590._8_4_ = uVar1;
              local_1590._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar57);
              local_17f0.context = context->user;
              local_1570._4_4_ = uVar56;
              local_1570._0_4_ = uVar56;
              local_1570._8_4_ = uVar56;
              local_1570._12_4_ = uVar56;
              local_1580 = *(undefined4 *)((long)&local_1400 + uVar57);
              local_15d0 = *(undefined4 *)((long)local_1280 + uVar57);
              uVar1 = *(undefined4 *)(local_1260 + uVar57);
              local_15c0._4_4_ = uVar1;
              local_15c0._0_4_ = uVar1;
              local_15c0._8_4_ = uVar1;
              local_15c0._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_1240 + uVar57);
              local_15b0._4_4_ = uVar1;
              local_15b0._0_4_ = uVar1;
              local_15b0._8_4_ = uVar1;
              local_15b0._12_4_ = uVar1;
              vpcmpeqd_avx2(ZEXT1632(local_1570),ZEXT1632(local_1570));
              uStack_155c = (local_17f0.context)->instID[0];
              local_1560 = uStack_155c;
              uStack_1558 = uStack_155c;
              uStack_1554 = uStack_155c;
              uStack_1550 = (local_17f0.context)->instPrimID[0];
              uStack_154c = uStack_1550;
              uStack_1548 = uStack_1550;
              uStack_1544 = uStack_1550;
              local_1850 = *local_1838;
              local_17f0.valid = (int *)local_1850;
              local_17f0.geometryUserPtr = pGVar5->userPtr;
              local_17f0.hit = (RTCHitN *)&local_15d0;
              local_17f0.N = 4;
              local_17f0.ray = (RTCRayN *)ray;
              uStack_15cc = local_15d0;
              uStack_15c8 = local_15d0;
              uStack_15c4 = local_15d0;
              uStack_159c = local_15a0;
              uStack_1598 = local_15a0;
              uStack_1594 = local_15a0;
              uStack_157c = local_1580;
              uStack_1578 = local_1580;
              uStack_1574 = local_1580;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)(&local_17f0);
                auVar109 = ZEXT3264(local_16e0);
                auVar105 = ZEXT3264(local_16c0);
                auVar102 = ZEXT3264(local_16a0);
                fVar112 = local_1700;
                fVar115 = fStack_16fc;
                fVar117 = fStack_16f8;
                fVar118 = fStack_16f4;
                fVar119 = fStack_16f0;
                fVar120 = fStack_16ec;
                fVar121 = fStack_16e8;
                fVar113 = local_1720;
                fVar124 = fStack_171c;
                fVar125 = fStack_1718;
                fVar126 = fStack_1714;
                fVar127 = fStack_1710;
                fVar128 = fStack_170c;
                fVar129 = fStack_1708;
                fVar114 = local_1740;
                fVar130 = fStack_173c;
                fVar131 = fStack_1738;
                fVar132 = fStack_1734;
                fVar133 = fStack_1730;
                fVar134 = fStack_172c;
                fVar135 = fStack_1728;
                fVar106 = local_1760;
                fVar137 = fStack_175c;
                fVar138 = fStack_1758;
                fVar139 = fStack_1754;
                fVar140 = fStack_1750;
                fVar141 = fStack_174c;
                fVar142 = fStack_1748;
                fVar110 = local_1780;
                fVar144 = fStack_177c;
                fVar145 = fStack_1778;
                fVar146 = fStack_1774;
                fVar147 = fStack_1770;
                fVar148 = fStack_176c;
                fVar149 = fStack_1768;
                fVar111 = local_17a0;
                fVar151 = fStack_179c;
                fVar152 = fStack_1798;
                fVar153 = fStack_1794;
                fVar154 = fStack_1790;
                fVar155 = fStack_178c;
                fVar156 = fStack_1788;
              }
              if (local_1850 == (undefined1  [16])0x0) {
                auVar4 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar4 = auVar4 ^ _DAT_01f46b70;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var6)(&local_17f0);
                  auVar109 = ZEXT3264(local_16e0);
                  auVar105 = ZEXT3264(local_16c0);
                  auVar102 = ZEXT3264(local_16a0);
                  fVar112 = local_1700;
                  fVar115 = fStack_16fc;
                  fVar117 = fStack_16f8;
                  fVar118 = fStack_16f4;
                  fVar119 = fStack_16f0;
                  fVar120 = fStack_16ec;
                  fVar121 = fStack_16e8;
                  fVar113 = local_1720;
                  fVar124 = fStack_171c;
                  fVar125 = fStack_1718;
                  fVar126 = fStack_1714;
                  fVar127 = fStack_1710;
                  fVar128 = fStack_170c;
                  fVar129 = fStack_1708;
                  fVar114 = local_1740;
                  fVar130 = fStack_173c;
                  fVar131 = fStack_1738;
                  fVar132 = fStack_1734;
                  fVar133 = fStack_1730;
                  fVar134 = fStack_172c;
                  fVar135 = fStack_1728;
                  fVar106 = local_1760;
                  fVar137 = fStack_175c;
                  fVar138 = fStack_1758;
                  fVar139 = fStack_1754;
                  fVar140 = fStack_1750;
                  fVar141 = fStack_174c;
                  fVar142 = fStack_1748;
                  fVar110 = local_1780;
                  fVar144 = fStack_177c;
                  fVar145 = fStack_1778;
                  fVar146 = fStack_1774;
                  fVar147 = fStack_1770;
                  fVar148 = fStack_176c;
                  fVar149 = fStack_1768;
                  fVar111 = local_17a0;
                  fVar151 = fStack_179c;
                  fVar152 = fStack_1798;
                  fVar153 = fStack_1794;
                  fVar154 = fStack_1790;
                  fVar155 = fStack_178c;
                  fVar156 = fStack_1788;
                }
                auVar69 = vpcmpeqd_avx(local_1850,_DAT_01f45a50);
                auVar4 = auVar69 ^ _DAT_01f46b70;
                auVar72._8_4_ = 0xff800000;
                auVar72._0_8_ = 0xff800000ff800000;
                auVar72._12_4_ = 0xff800000;
                auVar69 = vblendvps_avx(auVar72,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                        auVar69);
                *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar69;
              }
              auVar83 = ZEXT3264(local_1660);
              auVar88 = ZEXT3264(local_1680);
              auVar69._8_8_ = 0x100000001;
              auVar69._0_8_ = 0x100000001;
              if ((auVar69 & auVar4) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = local_1620._0_4_;
                uVar57 = local_1600._0_8_ ^ 1L << (local_1820._0_8_ & 0x3f);
                goto LAB_01679cc2;
              }
            }
            *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
            goto LAB_01679dd2;
          }
          uVar57 = uVar57 ^ 1L << (uVar60 & 0x3f);
LAB_01679cc2:
          pSVar59 = local_17c0;
        } while (uVar57 != 0);
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }